

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl.c
# Opt level: O2

_Bool tmidl_parser_parse(tmidl_parser_o *parser,char *input,tmidl_callbacks_i *callbacks,
                        void *user_context)

{
  uint32_t uVar1;
  long lVar2;
  int *piVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  tmidl_function_t *ptVar9;
  char *pcVar10;
  size_t i_2;
  size_t i_1;
  ulong uVar11;
  int i;
  long lVar12;
  tmidl_diagnostic_t diagnostic;
  tmidl_function_t **local_70;
  ulong uStack_68;
  mpc_result_t r;
  tmidl_callbacks_i *local_40;
  long local_38;
  
  iVar6 = mpc_parse("input",input,parser->module_parser,&r);
  if (iVar6 == 0) {
    pcVar10 = mpc_err_string(r.error);
    diagnostic.level = TMIDL_LEVEL_ERROR;
    diagnostic.position_start = (uint32_t)((r.error)->state).pos;
    diagnostic.position_end = diagnostic.position_start + 1;
    diagnostic.message = pcVar10;
    (*callbacks->on_diagnostic)(&diagnostic,user_context);
    free(pcVar10);
    mpc_err_delete(r.error);
  }
  else {
    lVar2 = ((r.error)->state).pos;
    local_40 = callbacks;
    for (lVar12 = 0; lVar12 < (int)((r.error)->state).row; lVar12 = lVar12 + 1) {
      piVar3 = *(int **)(lVar2 + lVar12 * 8);
      if (*piVar3 == 1) {
        (*callbacks->on_module_doc)(*(char **)(piVar3 + 2),user_context);
      }
      else if (*piVar3 == 0) {
        puVar4 = *(undefined8 **)(piVar3 + 2);
        piVar3 = (int *)puVar4[2];
        if (*piVar3 == 1) {
          local_38 = *(long *)(piVar3 + 6);
          if (*(int *)(puVar4 + 1) != 1) {
            diagnostic.level = TMIDL_LEVEL_WARNING;
            diagnostic.message =
                 "Top level structure declaration must have a typedef storage class.";
            diagnostic._16_8_ = puVar4[4];
            (*callbacks->on_diagnostic)(&diagnostic,user_context);
          }
          if ((char *)puVar4[3] != (char *)0x0) {
            pcVar10 = *(char **)(piVar3 + 2);
            iVar7 = strcmp((char *)puVar4[3],pcVar10);
            if (iVar7 != 0) {
              uVar1 = piVar3[4];
              diagnostic.level = TMIDL_LEVEL_WARNING;
              diagnostic.message = "The type specifier name must be the same as the declarator.";
              diagnostic.position_start = uVar1;
              sVar8 = strlen(pcVar10);
              diagnostic.position_end = (int)sVar8 + uVar1;
              (*callbacks->on_diagnostic)(&diagnostic,user_context);
            }
          }
          diagnostic.level = (tmidl_level_t)(local_38 != 0);
          diagnostic.message = *(char **)(piVar3 + 2);
          diagnostic._16_8_ = *puVar4;
          local_70 = (tmidl_function_t **)0x0;
          uStack_68 = 0;
          if (local_38 != 0) {
            uStack_68 = (ulong)(int)(*(long **)(piVar3 + 6))[1];
            lVar5 = **(long **)(piVar3 + 6);
            local_70 = (tmidl_function_t **)malloc(uStack_68 * 8);
            for (uVar11 = 0; uStack_68 != uVar11; uVar11 = uVar11 + 1) {
              ptVar9 = (tmidl_function_t *)malloc(8);
              local_70[uVar11] = ptVar9;
              ptVar9->name = *(char **)(*(long *)(lVar5 + uVar11 * 8) + 0x18);
            }
          }
          callbacks = local_40;
          (*local_40->on_declaration)((tmidl_declaration_t *)&diagnostic,user_context);
          if (local_70 != (tmidl_function_t **)0x0) {
            for (uVar11 = 0; uVar11 < uStack_68; uVar11 = uVar11 + 1) {
              free(local_70[uVar11]);
            }
            free(local_70);
          }
        }
        else if (*piVar3 == 0) {
          diagnostic.level = TMIDL_LEVEL_WARNING;
          diagnostic.message = "Only structure declarations are allowed at the top level.";
          diagnostic._16_8_ = puVar4[4];
          (*callbacks->on_diagnostic)(&diagnostic,user_context);
        }
      }
    }
    free_items(r.output);
  }
  return iVar6 != 0;
}

Assistant:

bool tmidl_parser_parse(
    tmidl_parser_o *parser,
    const char *input,
    const tmidl_callbacks_i *callbacks,
    void *user_context)
{
    // Parse the input
    mpc_result_t r;
    bool success = mpc_parse("input", input, parser->module_parser, &r);

    if (!success) {
        char *message = mpc_err_string(r.error);

        tmidl_diagnostic_t diagnostic;
        diagnostic.level = TMIDL_LEVEL_ERROR;
        diagnostic.message = message;
        diagnostic.position_start = r.error->state.pos;
        diagnostic.position_end = r.error->state.pos + 1;
        callbacks->on_diagnostic(&diagnostic, user_context);

        free(message);
        mpc_err_delete(r.error);
        return false;
    }

    // Pass items to caller
    util_array_t *array = r.output;
    c_item_t **items = array->ptr;

    for (int i = 0; i < array->count; i++) {
        c_item_t *item = items[i];

        switch (item->type) {
        case C_ITEM_TYPE_DECLARATION:
            handle_declaration(((c_item_declaration_t *)item)->declaration, callbacks, user_context);
            break;
        case C_ITEM_TYPE_MODULE_DOC:
            callbacks->on_module_doc(((c_item_module_doc_t *)item)->doc, user_context);
            break;
        }
    }

    // Clean up the parsed items
    free_items(array);

    return true;
}